

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

int hydro_hash_init(hydro_hash_state *state,char *ctx,uint8_t *key)

{
  size_t in_len;
  undefined4 local_68;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined6 uStack_60;
  undefined2 uStack_5a;
  undefined1 uStack_58;
  undefined7 uStack_57;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 uStack_48;
  undefined7 uStack_47;
  undefined1 uStack_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  uStack_62 = 0;
  uStack_60 = 0;
  uStack_5a = 0;
  uStack_58 = 0;
  uStack_57 = 0;
  uStack_50 = 0;
  uStack_4f = 0;
  uStack_48 = 0;
  uStack_47 = 0;
  uStack_40 = 0;
  uStack_3f = 0;
  uStack_38 = 0;
  uStack_37 = 0;
  uStack_30 = 0;
  local_68 = 0x616d6b04;
  uStack_64 = 0x863;
  mem_zero(&uStack_5a,0x32);
  uStack_62 = (undefined2)*(undefined8 *)ctx;
  uStack_60 = (undefined6)((ulong)*(undefined8 *)ctx >> 0x10);
  if (key == (uint8_t *)0x0) {
    in_len = 0x20;
    uStack_58 = 0;
  }
  else {
    uStack_57 = (undefined7)*(undefined8 *)key;
    uStack_50 = (undefined1)((ulong)*(undefined8 *)key >> 0x38);
    uStack_4f = (undefined7)*(undefined8 *)(key + 8);
    uStack_48 = (undefined1)((ulong)*(undefined8 *)(key + 8) >> 0x38);
    uStack_47 = (undefined7)*(undefined8 *)(key + 0x10);
    uStack_40 = (undefined1)((ulong)*(undefined8 *)(key + 0x10) >> 0x38);
    uStack_3f = (undefined7)*(undefined8 *)(key + 0x18);
    uStack_38 = (undefined1)((ulong)*(undefined8 *)(key + 0x18) >> 0x38);
    in_len = 0x40;
    uStack_58 = 0x20;
  }
  mem_zero(state,0x34);
  hydro_hash_update(state,&local_68,in_len);
  return 0;
}

Assistant:

int
hydro_hash_init(hydro_hash_state *state, const char ctx[hydro_hash_CONTEXTBYTES],
                const uint8_t key[hydro_hash_KEYBYTES])
{
    uint8_t block[64] = { 4, 'k', 'm', 'a', 'c', 8 };
    size_t  p;

    COMPILER_ASSERT(hydro_hash_KEYBYTES <= sizeof block - gimli_RATE - 1);
    COMPILER_ASSERT(hydro_hash_CONTEXTBYTES == 8);
    mem_zero(block + 14, sizeof block - 14);
    memcpy(block + 6, ctx, 8);
    if (key != NULL) {
        block[gimli_RATE] = (uint8_t) hydro_hash_KEYBYTES;
        memcpy(block + gimli_RATE + 1, key, hydro_hash_KEYBYTES);
        p = (gimli_RATE + 1 + hydro_hash_KEYBYTES + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    } else {
        block[gimli_RATE] = (uint8_t) 0;
        p                 = (gimli_RATE + 1 + 0 + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    }
    mem_zero(state, sizeof *state);
    hydro_hash_update(state, block, p);

    return 0;
}